

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::sectionEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,SectionStats *sectionStats)

{
  SectionStats *in_RDI;
  SectionNode *node;
  SectionStats *in_stack_ffffffffffffffd8;
  
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  ::back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
          *)in_RDI);
  clara::std::
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_RDI);
  SectionStats::operator=(in_RDI,in_stack_ffffffffffffffd8);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  ::pop_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
              *)0x1660a5);
  return;
}

Assistant:

void sectionEnded(SectionStats const& sectionStats) override {
            assert(!m_sectionStack.empty());
            SectionNode& node = *m_sectionStack.back();
            node.stats = sectionStats;
            m_sectionStack.pop_back();
        }